

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Process.cpp
# Opt level: O2

int asl::Process::exec(String *command,Array<asl::String> *args)

{
  String *pSVar1;
  int iVar2;
  long lVar3;
  anon_union_16_2_78e7fdac_for_String_2 *__file;
  int i;
  long lVar4;
  Array<const_char_*> argv;
  anon_union_16_2_78e7fdac_for_String_2 *local_40;
  anon_union_16_2_78e7fdac_for_String_2 *local_38;
  
  Array<const_char_*>::Array(&argv);
  local_38 = &command->field_2;
  local_40 = local_38;
  if (command->_size != 0) {
    local_40 = (anon_union_16_2_78e7fdac_for_String_2 *)(command->field_2)._str;
  }
  Array<const_char_*>::operator<<(&argv,(char **)&local_40);
  lVar3 = 8;
  for (lVar4 = 0; pSVar1 = args->_a, lVar4 < *(int *)&pSVar1[-1].field_2; lVar4 = lVar4 + 1) {
    if (*(int *)((long)pSVar1 + lVar3 + -8) == 0) {
      local_40 = (anon_union_16_2_78e7fdac_for_String_2 *)((long)&pSVar1->_size + lVar3);
    }
    else {
      local_40 = *(anon_union_16_2_78e7fdac_for_String_2 **)((long)&pSVar1->_size + lVar3);
    }
    Array<const_char_*>::operator<<(&argv,(char **)&local_40);
    lVar3 = lVar3 + 0x18;
  }
  local_40 = (anon_union_16_2_78e7fdac_for_String_2 *)0x0;
  Array<const_char_*>::operator<<(&argv,(char **)&local_40);
  __file = local_38;
  if (command->_size != 0) {
    __file = (anon_union_16_2_78e7fdac_for_String_2 *)(command->field_2)._str;
  }
  iVar2 = execvp(__file->_space,argv._a);
  Array<const_char_*>::~Array(&argv);
  return iVar2;
}

Assistant:

int Process::exec(const String& command, const Array<String>& args)
{
	Array<const char*> argv;
	argv << command;
	for(int i=0; i<args.length(); i++)
		argv << args[i];
	argv << 0;
	return execvp(command, (char* const*)argv.data());
}